

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_calculate_lod_instruction_fallback(Impl *impl,CallInst *instruction)

{
  undefined8 uVar1;
  bool bVar2;
  Id IVar3;
  Id IVar4;
  Dim DVar5;
  void *pvVar6;
  Builder *this;
  Value *pVVar7;
  Operation *pOVar8;
  APInt *this_00;
  uint64_t uVar9;
  Operation *clamp_op;
  initializer_list<unsigned_int> local_1170;
  Operation *local_1160;
  Operation *max_op;
  initializer_list<unsigned_int> local_1150;
  Operation *local_1140;
  Operation *min_op;
  Operation *max_level;
  Operation *f_levels;
  Operation *levels_op;
  Constant *pCStack_1118;
  bool clamped;
  ConstantInt *clamped_value;
  Id local_1108;
  Id lod;
  initializer_list<unsigned_int> local_1100;
  Operation *local_10f0;
  Operation *scale_y;
  initializer_list<unsigned_int> local_10e0;
  Operation *local_10d0;
  Operation *scale_x;
  Operation *fconv;
  Operation *pOStack_10b8;
  uint i_1;
  Operation *shuffle_op;
  initializer_list<unsigned_int> local_10a8;
  Operation *local_1098;
  Operation *query_op;
  Id local_1088;
  Id grad_y_id;
  Id grad_x_id;
  uint32_t num_size_coords;
  Operation *grad_y;
  Operation *grad_x;
  Operation *swap_y;
  Operation *swap_x;
  Id local_1058;
  Id fvec_type;
  Id f32_type;
  Id i32_type;
  Id coord_vec;
  uint i;
  Id coords [3];
  uint32_t num_coords;
  uint32_t num_coords_full;
  Id image_id;
  Builder *builder;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  CallInst *instruction_local;
  Impl *impl_local;
  
  buffer._4088_8_ = get_thread_log_callback();
  if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
    fprintf(_stderr,
            "[WARN]: Emitting non-conformant CalculateLevelOfDetail. Missing NV_compute_shader_derivatives.\n"
           );
    fflush(_stderr);
  }
  else {
    snprintf((char *)&builder,0x1000,
             "Emitting non-conformant CalculateLevelOfDetail. Missing NV_compute_shader_derivatives.\n"
            );
    uVar1 = buffer._4088_8_;
    pvVar6 = get_thread_log_callback_userdata();
    (*(code *)uVar1)(pvVar6,1,&builder);
  }
  this = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this,CapabilityImageQuery);
  spv::Builder::addCapability(this,CapabilityGroupNonUniformQuad);
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
  coords[2] = 0;
  coords[1] = 0;
  bVar2 = get_image_dimensions(impl,IVar3,coords + 2,coords + 1);
  if (bVar2) {
    memset(&coord_vec,0,0xc);
    for (i32_type = 0; i32_type < coords[1]; i32_type = i32_type + 1) {
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,i32_type + 3);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
      (&coord_vec)[i32_type] = IVar4;
    }
    IVar4 = spv::Builder::makeFloatType(this,0x20);
    f32_type = Converter::Impl::build_vector(impl,IVar4,&coord_vec,coords[1]);
    fvec_type = spv::Builder::makeIntType(this,0x20);
    local_1058 = spv::Builder::makeFloatType(this,0x20);
    swap_x._4_4_ = spv::Builder::makeVectorType(this,local_1058,coords[1]);
    pOVar8 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,swap_x._4_4_);
    swap_y = pOVar8;
    IVar4 = spv::Builder::makeUintConstant(this,3,false);
    Operation::add_id(pOVar8,IVar4);
    Operation::add_id(swap_y,f32_type);
    pOVar8 = swap_y;
    IVar4 = spv::Builder::makeUintConstant(this,0,false);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add(impl,swap_y,false);
    pOVar8 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,swap_x._4_4_);
    grad_x = pOVar8;
    IVar4 = spv::Builder::makeUintConstant(this,3,false);
    Operation::add_id(pOVar8,IVar4);
    Operation::add_id(grad_x,f32_type);
    pOVar8 = grad_x;
    IVar4 = spv::Builder::makeUintConstant(this,1,false);
    Operation::add_id(pOVar8,IVar4);
    Converter::Impl::add(impl,grad_x,false);
    grad_y = Converter::Impl::allocate(impl,OpFSub,swap_x._4_4_);
    Operation::add_id(grad_y,swap_y->id);
    Operation::add_id(grad_y,f32_type);
    Converter::Impl::add(impl,grad_y,false);
    _grad_x_id = Converter::Impl::allocate(impl,OpFSub,swap_x._4_4_);
    Operation::add_id(_grad_x_id,grad_x->id);
    Operation::add_id(_grad_x_id,f32_type);
    Converter::Impl::add(impl,_grad_x_id,false);
    bVar2 = get_image_dimensions_query_size(impl,this,IVar3,&grad_y_id);
    if (bVar2) {
      local_1088 = grad_y->id;
      query_op._4_4_ = _grad_x_id->id;
      IVar4 = Converter::Impl::get_type_id(impl,IVar3);
      DVar5 = spv::Builder::getTypeDimensionality(this,IVar4);
      if (DVar5 == DimCube) {
        emit_calculate_lod_cube_gradient_transform
                  (impl,f32_type,grad_y->id,_grad_x_id->id,&local_1088,(Id *)((long)&query_op + 4));
        swap_x._4_4_ = spv::Builder::makeVectorType(this,local_1058,2);
        coords[1] = 2;
      }
      IVar4 = spv::Builder::makeVectorType(this,fvec_type,grad_y_id);
      pOVar8 = Converter::Impl::allocate(impl,OpImageQuerySizeLod,IVar4);
      shuffle_op._0_4_ = IVar3;
      local_1098 = pOVar8;
      shuffle_op._4_4_ = spv::Builder::makeIntConstant(this,0,false);
      local_10a8._M_array = (iterator)&shuffle_op;
      local_10a8._M_len = 2;
      Operation::add_ids(pOVar8,&local_10a8);
      Converter::Impl::add(impl,local_1098,false);
      if (coords[1] != grad_y_id) {
        IVar4 = spv::Builder::makeVectorType(this,fvec_type,coords[1]);
        pOStack_10b8 = Converter::Impl::allocate(impl,OpVectorShuffle,IVar4);
        Operation::add_id(pOStack_10b8,local_1098->id);
        Operation::add_id(pOStack_10b8,local_1098->id);
        for (fconv._4_4_ = 0; fconv._4_4_ < coords[1]; fconv._4_4_ = fconv._4_4_ + 1) {
          Operation::add_literal(pOStack_10b8,fconv._4_4_);
        }
        Converter::Impl::add(impl,pOStack_10b8,false);
        local_1098 = pOStack_10b8;
      }
      scale_x = Converter::Impl::allocate(impl,OpConvertSToF,swap_x._4_4_);
      Operation::add_id(scale_x,local_1098->id);
      Converter::Impl::add(impl,scale_x,false);
      local_10d0 = Converter::Impl::allocate(impl,OpFMul,swap_x._4_4_);
      scale_y._0_4_ = local_1088;
      scale_y._4_4_ = scale_x->id;
      local_10e0._M_array = (iterator)&scale_y;
      local_10e0._M_len = 2;
      Operation::add_ids(local_10d0,&local_10e0);
      Converter::Impl::add(impl,local_10d0,false);
      local_10f0 = Converter::Impl::allocate(impl,OpFMul,swap_x._4_4_);
      local_1108 = query_op._4_4_;
      lod = scale_x->id;
      local_1100._M_array = &local_1108;
      local_1100._M_len = 2;
      Operation::add_ids(local_10f0,&local_1100);
      Converter::Impl::add(impl,local_10f0,false);
      clamped_value._4_4_ = build_lod_from_gradient(impl,local_10d0->id,local_10f0->id);
      pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
      pCStack_1118 = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar7)->super_Constant;
      this_00 = LLVMBC::Constant::getUniqueInteger(pCStack_1118);
      uVar9 = LLVMBC::APInt::getZExtValue(this_00);
      levels_op._7_1_ = uVar9 != 0;
      if ((bool)levels_op._7_1_) {
        IVar4 = spv::Builder::makeIntType(this,0x20);
        f_levels = Converter::Impl::allocate(impl,OpImageQueryLevels,IVar4);
        Operation::add_id(f_levels,IVar3);
        Converter::Impl::add(impl,f_levels,false);
        max_level = Converter::Impl::allocate(impl,OpConvertSToF,local_1058);
        Operation::add_id(max_level,f_levels->id);
        Converter::Impl::add(impl,max_level,false);
        min_op = Converter::Impl::allocate(impl,OpFSub,local_1058);
        Operation::add_id(min_op,max_level->id);
        pOVar8 = min_op;
        IVar3 = spv::Builder::makeFloatConstant(this,-1.0,false);
        Operation::add_id(pOVar8,IVar3);
        Converter::Impl::add(impl,min_op,false);
        local_1140 = Converter::Impl::allocate(impl,OpExtInst,local_1058);
        Operation::add_id(local_1140,impl->glsl_std450_ext);
        Operation::add_literal(local_1140,0x25);
        max_op._0_4_ = clamped_value._4_4_;
        max_op._4_4_ = min_op->id;
        local_1150._M_array = (iterator)&max_op;
        local_1150._M_len = 2;
        Operation::add_ids(local_1140,&local_1150);
        Converter::Impl::add(impl,local_1140,false);
        local_1160 = Converter::Impl::allocate(impl,OpExtInst,local_1058);
        Operation::add_id(local_1160,impl->glsl_std450_ext);
        Operation::add_literal(local_1160,0x28);
        pOVar8 = local_1160;
        clamp_op._0_4_ = local_1140->id;
        clamp_op._4_4_ = spv::Builder::makeFloatConstant(this,0.0,false);
        local_1170._M_array = (iterator)&clamp_op;
        local_1170._M_len = 2;
        Operation::add_ids(pOVar8,&local_1170);
        Converter::Impl::add(impl,local_1160,false);
        clamped_value._4_4_ = local_1160->id;
      }
      else {
        pOVar8 = Converter::Impl::allocate(impl,OpExtInst,local_1058);
        Operation::add_id(pOVar8,impl->glsl_std450_ext);
        Operation::add_literal(pOVar8,0x2b);
        Operation::add_id(pOVar8,clamped_value._4_4_);
        IVar3 = spv::Builder::makeFloatConstant(this,-128.0,false);
        Operation::add_id(pOVar8,IVar3);
        IVar3 = spv::Builder::makeFloatConstant(this,128.0,false);
        Operation::add_id(pOVar8,IVar3);
        Converter::Impl::add(impl,pOVar8,false);
        clamped_value._4_4_ = pOVar8->id;
      }
      Converter::Impl::rewrite_value(impl,(Value *)instruction,clamped_value._4_4_);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_calculate_lod_instruction_fallback(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	LOGW("Emitting non-conformant CalculateLevelOfDetail. Missing NV_compute_shader_derivatives.\n");
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityImageQuery);
	builder.addCapability(spv::CapabilityGroupNonUniformQuad);

	// Best effort workaround. Extremely unlikely that this will be a real problem in practice.
	// Only Pascal should ever hit this path.
	// Assumes sampler with no LOD bias and no mip clamp + trilinear.
	// Same concerns as sampler feedback where we need side channel data to be conformant.

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coords[3] = {};
	for (unsigned i = 0; i < num_coords; i++)
		coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	spv::Id coord_vec = impl.build_vector(builder.makeFloatType(32), coords, num_coords);

	spv::Id i32_type = builder.makeIntType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id fvec_type = builder.makeVectorType(f32_type, num_coords);

	auto *swap_x = impl.allocate(spv::OpGroupNonUniformQuadSwap, fvec_type);
	swap_x->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	swap_x->add_id(coord_vec);
	swap_x->add_id(builder.makeUintConstant(0));
	impl.add(swap_x);

	auto *swap_y = impl.allocate(spv::OpGroupNonUniformQuadSwap, fvec_type);
	swap_y->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	swap_y->add_id(coord_vec);
	swap_y->add_id(builder.makeUintConstant(1));
	impl.add(swap_y);

	auto *grad_x = impl.allocate(spv::OpFSub, fvec_type);
	grad_x->add_id(swap_x->id);
	grad_x->add_id(coord_vec);
	impl.add(grad_x);

	auto *grad_y = impl.allocate(spv::OpFSub, fvec_type);
	grad_y->add_id(swap_y->id);
	grad_y->add_id(coord_vec);
	impl.add(grad_y);

	uint32_t num_size_coords;
	if (!get_image_dimensions_query_size(impl, builder, image_id, &num_size_coords))
		return false;

	spv::Id grad_x_id = grad_x->id;
	spv::Id grad_y_id = grad_y->id;
	if (builder.getTypeDimensionality(impl.get_type_id(image_id)) == spv::DimCube)
	{
		emit_calculate_lod_cube_gradient_transform(impl, coord_vec,
		                                           grad_x->id, grad_y->id,
		                                           grad_x_id, grad_y_id);

		// Projected down to 2 dimensions now.
		fvec_type = builder.makeVectorType(f32_type, 2);
		num_coords = 2;
	}

	auto *query_op = impl.allocate(spv::OpImageQuerySizeLod, builder.makeVectorType(i32_type, num_size_coords));
	query_op->add_ids({ image_id, builder.makeIntConstant(0) });
	impl.add(query_op);

	if (num_coords != num_size_coords)
	{
		auto *shuffle_op = impl.allocate(spv::OpVectorShuffle, builder.makeVectorType(i32_type, num_coords));
		shuffle_op->add_id(query_op->id);
		shuffle_op->add_id(query_op->id);
		for (unsigned i = 0; i < num_coords; i++)
			shuffle_op->add_literal(i);
		impl.add(shuffle_op);

		query_op = shuffle_op;
	}

	auto *fconv = impl.allocate(spv::OpConvertSToF, fvec_type);
	fconv->add_id(query_op->id);
	impl.add(fconv);

	auto *scale_x = impl.allocate(spv::OpFMul, fvec_type);
	scale_x->add_ids({ grad_x_id, fconv->id });
	impl.add(scale_x);

	auto *scale_y = impl.allocate(spv::OpFMul, fvec_type);
	scale_y->add_ids({ grad_y_id, fconv->id });
	impl.add(scale_y);

	spv::Id lod = build_lod_from_gradient(impl, scale_x->id, scale_y->id);

	auto *clamped_value = llvm::cast<llvm::ConstantInt>(instruction->getOperand(6));
	bool clamped = clamped_value->getUniqueInteger().getZExtValue() != 0;

	if (clamped)
	{
		auto *levels_op = impl.allocate(spv::OpImageQueryLevels, builder.makeIntType(32));
		levels_op->add_id(image_id);
		impl.add(levels_op);

		auto *f_levels = impl.allocate(spv::OpConvertSToF, f32_type);
		f_levels->add_id(levels_op->id);
		impl.add(f_levels);

		auto *max_level = impl.allocate(spv::OpFSub, f32_type);
		max_level->add_id(f_levels->id);
		max_level->add_id(builder.makeFloatConstant(-1.0f));
		impl.add(max_level);

		// In case of null descriptor, make sure we end up with 0, so do min, then max.
		auto *min_op = impl.allocate(spv::OpExtInst, f32_type);
		min_op->add_id(impl.glsl_std450_ext);
		min_op->add_literal(GLSLstd450FMin);
		min_op->add_ids({ lod, max_level->id });
		impl.add(min_op);

		auto *max_op = impl.allocate(spv::OpExtInst, f32_type);
		max_op->add_id(impl.glsl_std450_ext);
		max_op->add_literal(GLSLstd450FMax);
		max_op->add_ids({ min_op->id, builder.makeFloatConstant(0.0f) });
		impl.add(max_op);

		lod = max_op->id;
	}
	else
	{
		// The assumption is still fixed point,
		// and real hardware will not return -inf here. Clamp to [-128, 128] which has been observed in the wild.
		auto *clamp_op = impl.allocate(spv::OpExtInst, f32_type);
		clamp_op->add_id(impl.glsl_std450_ext);
		clamp_op->add_literal(GLSLstd450FClamp);
		clamp_op->add_id(lod);
		clamp_op->add_id(builder.makeFloatConstant(-128.0f));
		clamp_op->add_id(builder.makeFloatConstant(+128.0f));
		impl.add(clamp_op);

		lod = clamp_op->id;
	}

	impl.rewrite_value(instruction, lod);
	return true;
}